

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

void Gia_ManCycle(Gia_Man_t *p,Abc_Cex_t *pCex,int nFrames)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  bool bVar7;
  uint local_4c;
  int local_40;
  int local_3c;
  int k;
  int i;
  Gia_Obj_t *pObjRo;
  Gia_Obj_t *pObjRi;
  Gia_Obj_t *pObj;
  int nFrames_local;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *p_local;
  
  Gia_ManRandom(1);
  if ((pCex != (Abc_Cex_t *)0x0) && (pCex->iFrame < nFrames)) {
    __assert_fail("pCex == NULL || nFrames <= pCex->iFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x287,"void Gia_ManCycle(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  for (local_3c = 0; local_3c < nFrames; local_3c = local_3c + 1) {
    local_40 = 0;
    while( true ) {
      iVar3 = Gia_ManPiNum(p);
      bVar7 = false;
      if (local_40 < iVar3) {
        pObjRi = Gia_ManCi(p,local_40);
        bVar7 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      if (pCex == (Abc_Cex_t *)0x0) {
        local_4c = Gia_ManRandom(0);
        local_4c = local_4c & 1;
      }
      else {
        local_4c = Abc_InfoHasBit((uint *)(pCex + 1),pCex->nRegs + local_3c * pCex->nPis + local_40)
        ;
      }
      *(ulong *)pObjRi = *(ulong *)pObjRi & 0xffffffffbfffffff | ((ulong)local_4c & 1) << 0x1e;
      local_40 = local_40 + 1;
    }
    local_40 = 0;
    while( true ) {
      bVar7 = false;
      if (local_40 < p->nObjs) {
        pObjRi = Gia_ManObj(p,local_40);
        bVar7 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar3 = Gia_ObjIsAnd(pObjRi);
      if (iVar3 != 0) {
        pGVar6 = Gia_ObjFanin0(pObjRi);
        uVar2 = *(ulong *)pGVar6;
        uVar5 = Gia_ObjFaninC0(pObjRi);
        pGVar6 = Gia_ObjFanin1(pObjRi);
        uVar1 = *(ulong *)pGVar6;
        uVar4 = Gia_ObjFaninC1(pObjRi);
        *(ulong *)pObjRi =
             *(ulong *)pObjRi & 0xffffffffbfffffff |
             ((ulong)(((uint)(uVar2 >> 0x1e) & 1 ^ uVar5) & ((uint)(uVar1 >> 0x1e) & 1 ^ uVar4)) & 1
             ) << 0x1e;
      }
      local_40 = local_40 + 1;
    }
    local_40 = 0;
    while( true ) {
      iVar3 = Vec_IntSize(p->vCos);
      bVar7 = false;
      if (local_40 < iVar3) {
        pObjRi = Gia_ManCo(p,local_40);
        bVar7 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      pGVar6 = Gia_ObjFanin0(pObjRi);
      uVar2 = *(ulong *)pGVar6;
      uVar5 = Gia_ObjFaninC0(pObjRi);
      *(ulong *)pObjRi =
           *(ulong *)pObjRi & 0xffffffffbfffffff |
           ((ulong)((uint)(uVar2 >> 0x1e) & 1 ^ uVar5) & 1) << 0x1e;
      local_40 = local_40 + 1;
    }
    local_40 = 0;
    while( true ) {
      iVar3 = Gia_ManRegNum(p);
      bVar7 = false;
      if (local_40 < iVar3) {
        iVar3 = Gia_ManPoNum(p);
        pObjRo = Gia_ManCo(p,iVar3 + local_40);
        bVar7 = false;
        if (pObjRo != (Gia_Obj_t *)0x0) {
          iVar3 = Gia_ManPiNum(p);
          _k = Gia_ManCi(p,iVar3 + local_40);
          bVar7 = _k != (Gia_Obj_t *)0x0;
        }
      }
      if (!bVar7) break;
      *(ulong *)_k = *(ulong *)_k & 0xffffffffbfffffff |
                     (ulong)((uint)(*(ulong *)pObjRo >> 0x1e) & 1) << 0x1e;
      local_40 = local_40 + 1;
    }
  }
  return;
}

Assistant:

void Gia_ManCycle( Gia_Man_t * p, Abc_Cex_t * pCex, int nFrames )
{
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int i, k;
    Gia_ManRandom( 1 );
    assert( pCex == NULL || nFrames <= pCex->iFrame );
    // iterate for the given number of frames
    for ( i = 0; i < nFrames; i++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = pCex ? Abc_InfoHasBit(pCex->pData, pCex->nRegs+i*pCex->nPis+k) : (1 & Gia_ManRandom(0));
        Gia_ManForEachAnd( p, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( p, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
    }
}